

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.cpp
# Opt level: O2

bool ReadDSK(MemFile *file,shared_ptr<Disk> *disk)

{
  uchar *args_1;
  byte bVar1;
  element_type *peVar2;
  Disk *pDVar3;
  pointer puVar4;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  it;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  itEnd;
  MemFile *pMVar5;
  pointer pSVar6;
  uint8_t *puVar7;
  uint8_t uVar8;
  char extraout_AL;
  uint num_heads;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  Merge MVar13;
  ssize_t sVar14;
  mapped_type *pmVar15;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar16;
  undefined8 extraout_RAX_01;
  Sector *this;
  exception *peVar17;
  Data *pDVar18;
  byte bVar19;
  uint uVar20;
  size_t in_RCX;
  undefined8 uVar21;
  DataRate *args_1_01;
  EDSK_OFFSETS *__new_size;
  uint uVar22;
  byte bVar23;
  size_type __n;
  size_t sVar24;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  uint8_t status2;
  uint8_t status1;
  uint local_29c;
  uint local_298;
  byte local_291;
  MemFile *local_290;
  uint8_t heads;
  uint8_t cyls;
  int uTrackSize;
  ulong local_280;
  uint local_274;
  EDSK_TRACK th;
  int local_250;
  CylHead cylhead;
  allocator<char> local_239;
  EDSK_OFFSETS eo;
  DataRate local_214;
  Track track;
  size_t uTail;
  vector<Sector,_std::allocator<Sector>_> local_1e8;
  vector<Data,_std::allocator<Data>_> local_1c8;
  uint local_1b0;
  Encoding local_1ac;
  uint local_1a8;
  uint local_1a4;
  ulong local_1a0;
  Data data;
  MEMORY mem;
  key_type local_158;
  uint8_t ab [256];
  Track *args_1_00;
  
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar14 = MemFile::read(file,(int)ab,(void *)0x100,in_RCX), (char)sVar14 == '\0')) ||
     ((ab._0_8_ != 0x4445444e45545845 && (ab._0_8_ != 0x435043202d20564d)))) {
    return false;
  }
  if ((char)ab[0x31] < '\0') {
    Message<>(msgWarning,"ignoring deprecated \'random data errors\' flag");
    ab[0x31] = ab[0x31] & 0x7f;
  }
  uVar8 = ab[0x31];
  uVar20 = (uint)ab[0x30];
  cyls = ab[0x30];
  heads = ab[0x31];
  if (ab[0x31] < 3) {
    if (ab[0x30] < 0x67) {
      track._0_8_ = &track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                     super__Vector_impl_data._M_finish;
      track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xe;
      track.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      util::trim((string *)&uTail,(string *)&track);
      peVar2 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&eo,"creator",(allocator<char> *)&local_158);
      local_290 = file;
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar2->metadata,(key_type *)&eo);
      args_1_01 = (DataRate *)(ab._0_8_ & 0xff);
      std::__cxx11::string::operator=((string *)pmVar15,(string *)&uTail);
      std::__cxx11::string::~string((string *)&eo);
      std::__cxx11::string::~string((string *)&uTail);
      std::__cxx11::string::~string((string *)&track);
      mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
      mem.size = 0xff00;
      mem.pb = AllocMem(0xff00);
      num_heads = (uint)uVar8;
      local_1a0 = 0;
      local_1b0 = (uint)ab[0x30];
      uVar9 = 0;
      while (pMVar5 = local_290, local_250 = (int)(EDSK_OFFSETS *)(ab._0_8_ & 0xff), uVar9 < uVar20)
      {
        uVar22 = 0;
        local_29c = uVar9;
        while (uVar22 < num_heads) {
          local_298 = uVar22;
          CylHead::CylHead(&cylhead,local_29c,uVar22);
          iVar10 = MemFile::tell(local_290);
          pMVar5 = local_290;
          if (local_250 == 0x45) {
            bVar1 = ab[(ulong)local_298 + (ulong)(uVar9 * num_heads) + 0x34];
            uTrackSize = (uint)bVar1 << 8;
            args_1_01 = (DataRate *)((ulong)bVar1 << 8);
            if (bVar1 != 0) goto LAB_0018d305;
            pDVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            Track::Track((Track *)&uTail,0);
            Disk::write(pDVar3,(int)&cylhead,(Track *)&uTail,(size_t)args_1_01);
LAB_0018d484:
            std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_1e8);
          }
          else {
            uTrackSize = (int)(ushort)ab._50_2_;
LAB_0018d305:
            if (0x27 < local_29c) {
              iVar11 = MemFile::tell(local_290);
              iVar12 = MemFile::size(pMVar5);
              if (iVar11 == iVar12) {
                uTail = (size_t)CH(local_29c,local_298);
                Message<char_const*>
                          (msgWarning,"%s track header is missing, assuming blank track",
                           (char **)&uTail);
                pDVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                Track::Track((Track *)&uTail,0);
                Disk::write(pDVar3,(int)&cylhead,(Track *)&uTail,(size_t)args_1_01);
                goto LAB_0018d484;
              }
            }
            sVar14 = MemFile::read(local_290,(int)&th,(void *)0x18,(size_t)args_1_01);
            if ((char)sVar14 == '\0') {
              peVar17 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[20],CylHead&>
                        (peVar17,(char (*) [20])"short file reading ",&cylhead);
LAB_0018dfbb:
              __cxa_throw(peVar17,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            iVar11 = bcmp(&th,"Track-Info\r\n",10);
            if (iVar11 != 0) {
              peVar17 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[28],CylHead&>
                        (peVar17,(char (*) [28])"track signature missing on ",&cylhead);
              goto LAB_0018dfbb;
            }
            if (7 < th.size && local_250 != 0x45) {
              uTail = (size_t)SizeStr((uint)th.size);
              track._0_8_ = CH(local_29c,local_298);
              Message<char_const*,char_const*>
                        (msgWarning,"invalid sector size code (%s) on %s",(char **)&uTail,
                         (char **)&track);
            }
            uVar20 = local_29c ^ th.track;
            args_1_00 = (Track *)(ulong)uVar20;
            uVar16 = 0;
            if (local_298 != th.side || uVar20 != 0) {
              if (local_29c == th.track) {
                uTail = (size_t)HeadStr((uint)th.side);
                track._0_8_ = HeadStr(local_298);
                args_1_00 = &track;
                Message<char_const*,char_const*>
                          (msgWarning,"header side %s != head %s",(char **)&uTail,(char **)args_1_00
                          );
                uVar16 = extraout_RAX;
              }
              else {
                uTail = (size_t)CylStr((uint)th.track);
                track._0_8_ = CylStr(local_29c);
                args_1_00 = &track;
                Message<char_const*,char_const*>
                          (msgWarning,"header track %s != cyl %s",(char **)&uTail,(char **)args_1_00
                          );
                uVar16 = extraout_RAX_00;
              }
            }
            uVar21 = CONCAT71((int7)((ulong)args_1_00 >> 8),th.unused[0]);
            uVar20 = (uint)CONCAT71((int7)((ulong)uVar16 >> 8),th.rate);
            if (th.unused[0] != '\0' && th.rate == '\0') {
              th.rate = th.unused[0];
              th.unused[0] = '\0';
              uVar20 = (uint)uVar21;
              uVar21 = 0;
            }
            if (th.unused[1] != '\0' && th.encoding == '\0') {
              th.encoding = th.unused[1];
              th.unused[1] = '\0';
            }
            if ((((char)uVar21 != '\0') || (th.unused[1] != '\0')) || (th.unused[2] != '\0')) {
              uTail = (size_t)CH(local_29c,local_298);
              Message<unsigned_char&,unsigned_char&,unsigned_char&,char_const*>
                        (msgWarning,"unused fields are non-zero (%02X %02X %02X) on %s",th.unused,
                         th.unused + 1,th.unused + 2,(char **)&uTail);
              uVar20 = (uint)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),th.rate);
            }
            args_1_01 = (DataRate *)(ulong)(uVar20 - 1);
            local_214 = _250K;
            if ((byte)(uVar20 - 1) < 3) {
              args_1_01 = ReadDSK::abEDSKRates;
              local_214 = ReadDSK::abEDSKRates[uVar20 & 0xff];
            }
            bVar27 = th.encoding == '\x01';
            Track::Track(&track,(uint)th.sectors);
            uVar20 = (uint)th.sectors;
            uVar22 = ((uint)th.sectors * 8 + 0x117 & 0xf00) - 0x18;
            if ((int)(uVar20 * 8) < (int)uVar22) {
              iVar11 = MemFile::size(local_290);
              iVar12 = MemFile::tell(local_290);
              if (iVar11 - iVar12 != uVar20 * 8) goto LAB_0018d610;
              uTail = (size_t)CH(local_29c,local_298);
              Message<char_const*>
                        (msgWarning,"%s track header is shorter than index size",(char **)&uTail);
            }
            else {
LAB_0018d610:
              sVar14 = MemFile::read(local_290,(int)mem.pb,(void *)(ulong)uVar22,(size_t)args_1_01);
              if ((char)sVar14 == '\0') {
                peVar17 = (exception *)__cxa_allocate_exception(0x10);
                util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[16]>
                          (peVar17,(char (*) [20])"short file reading ",&cylhead,
                           (char (*) [16])" sector headers");
                __cxa_throw(peVar17,&util::exception::typeinfo,std::runtime_error::~runtime_error);
              }
            }
            local_1ac = bVar27 + MFM;
            for (uVar26 = 0; puVar7 = mem.pb, uVar26 < th.sectors; uVar26 = uVar26 + 1) {
              Header::Header((Header *)&eo,(uint)mem.pb[uVar26 * 8],(uint)mem.pb[uVar26 * 8 + 1],
                             (uint)mem.pb[uVar26 * 8 + 2],(uint)mem.pb[uVar26 * 8 + 3]);
              Sector::Sector((Sector *)&uTail,local_214,local_1ac,(Header *)&eo,0);
              pSVar6 = local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              if ((int)uVar26 < (int)(th.sectors - 1)) {
                local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)(ulong)CONCAT14(th.gap3,local_1e8.
                                                                                                            
                                                  super__Vector_base<Sector,_std::allocator<Sector>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_4_);
                if ((th.gap3 == 'R') || (th.gap3 == 'N')) {
                  local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)((ulong)pSVar6 & 0xffffffff);
                }
              }
              status1 = puVar7[uVar26 * 8 + 4];
              status2 = puVar7[uVar26 * 8 + 5];
              local_274 = (uint)status2;
              bVar1 = status2 & 0x20;
              local_1a4 = (local_274 & 0x20) >> 5;
              bVar19 = status1 & 0x20;
              bVar23 = bVar19 == 0 | (byte)local_1a4;
              local_280 = uVar26;
              if (bVar23 == 0) {
                Sector::set_badidcrc((Sector *)&uTail,true);
                bVar19 = status1 & 0x20;
              }
              if ((bVar19 != 0) && ((status2 & 1) != 0)) {
                eo.signature._0_8_ =
                     CHSR(local_29c,local_298,(int)local_280,
                          local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_);
                Message<char_const*>(msgWarning,"unsupported placeholder sector on %s",(char **)&eo)
                ;
                status2 = status2 & 0xfe;
              }
              if (((status1 & 0x4a) != 0) || ((status2 & 0x8c) != 0)) {
                eo.signature._0_8_ =
                     CHSR(local_29c,local_298,(int)local_280,
                          local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_);
                Message<unsigned_char&,unsigned_char&,char_const*>
                          (msgWarning,"invalid status (ST1=%02X ST2=%02X) for %s",&status1,&status2,
                           (char **)&eo);
                status1 = status1 & 0xb5;
                status2 = status2 & 0x73;
              }
              if ((status1 != '\0' || status2 != '@' && status2 != '\0') &&
                 (status1 != 0x80 || status2 != '\0')) {
                if ((((status1 != ' ') || (status2 != '\0' && (status2 & 0xbf) != 0x20)) &&
                    (1 < status1 || status2 != '\x01')) &&
                   ((status1 != '\x04' || ((status2 & 0xef) != 0)))) {
                  eo.signature._0_8_ =
                       CHSR(local_29c,local_298,(int)local_280,
                            local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
                  Message<unsigned_char&,unsigned_char&,char_const*>
                            (msgWarning,"unusual status flags (ST1=%02X ST2=%02X) for %s",&status1,
                             &status2,(char **)&eo);
                }
              }
              iVar11 = Sector::size((Sector *)&uTail);
              if (local_250 == 0x45) {
                uVar20 = (uint)*(ushort *)(puVar7 + local_280 * 8 + 6);
              }
              else {
                uVar20 = Sector::SizeCodeToLength((uint)th.size);
              }
              uVar22 = local_274 & 1 ^ 1;
              if (((local_250 == 0x45) && (iVar11 < (int)uVar20)) && (bVar1 != 0)) {
                if ((uVar20 == 0xc000) || ((int)uVar20 % iVar11 == 0)) {
                  uVar22 = (int)uVar20 / iVar11;
                  if (uVar20 == 0xc000) {
                    uVar22 = 3;
                  }
                  uVar20 = (int)uVar20 / (int)uVar22;
                }
              }
              local_291 = (local_274 & 1) == 0 & bVar23;
              __new_size = (EDSK_OFFSETS *)(long)iVar11;
              local_1a8 = (uint)((local_274 & 0x40) == 0) * 3 | 0xf8;
              args_1_01 = (DataRate *)__new_size;
              uVar26 = local_280;
              if ((int)uVar22 < 1) {
                uVar22 = 0;
              }
              while (bVar27 = uVar22 != 0, uVar22 = uVar22 - 1, bVar27) {
                __n = (size_type)(int)uVar20;
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                          (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__n,
                           (allocator_type *)&eo);
                bVar27 = MemFile::read<Data>(local_290,
                                             (Data *)&data.
                                                  super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                            );
                if (!bVar27) {
                  peVar17 = (exception *)__cxa_allocate_exception(0x10);
                  util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[9],int&>
                            (peVar17,(char (*) [20])"short file reading ",&cylhead,
                             (char (*) [9])0x1abda3,(int *)&local_1e8);
                  __cxa_throw(peVar17,&util::exception::typeinfo,std::runtime_error::~runtime_error)
                  ;
                }
                if (opt.fix == 0) {
LAB_0018da44:
                  if ((((local_274 & 0x20) != 0) && ((int)uVar20 % iVar11 == 1)) &&
                     (data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[__n - 1] == '{')) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                               __n - 1);
                    uVar20 = (uint)(__n - 1);
                  }
                }
                else {
                  peVar2 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_158,"creator",&local_239);
                  pmVar15 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&peVar2->metadata,&local_158);
                  args_1_01 = (DataRate *)0x3;
                  std::__cxx11::string::substr((ulong)&eo,(ulong)pmVar15);
                  bVar27 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&eo,"CPD");
                  if ((((local_274 & 0x20) != 0) || (!bVar27)) || ((int)uVar20 <= iVar11)) {
                    std::__cxx11::string::~string((string *)&eo);
                    std::__cxx11::string::~string((string *)&local_158);
                    uVar26 = local_280;
                    goto LAB_0018da44;
                  }
                  std::__cxx11::string::~string((string *)&eo);
                  std::__cxx11::string::~string((string *)&local_158);
                  uVar26 = local_280;
                  if ((int)uVar20 % iVar11 == 0) {
                    args_1_01 = (DataRate *)
                                ((ulong)local_1e8.
                                        super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                                        super__Vector_impl_data._M_start & 0xffffffff);
                    eo.signature._0_8_ =
                         CHSR(local_29c,local_298,(int)local_280,
                              local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
                    Message<char_const*>
                              (msgFix,"dropping suspicious excess data on %s",(char **)&eo);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                               (size_type)__new_size);
                  }
                }
                if (local_250 == 0x45) {
                  if (local_291 != 0) goto LAB_0018daac;
                  args_1_01 = (DataRate *)
                              ((ulong)local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>.
                                      _M_impl.super__Vector_impl_data._M_start & 0xffffffff);
                  eo.signature._0_8_ =
                       CHSR(local_29c,local_298,(int)uVar26,
                            local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_);
                  Message<char_const*>
                            (msgWarning,"ignoring stored data on %s, which has no data field",
                             (char **)&eo);
                }
                else if (local_291 != 0) {
                  if (iVar11 < (int)uVar20) {
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                              (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                               (long)(int)uVar20);
                  }
LAB_0018daac:
                  args_1_01 = (DataRate *)(ulong)(byte)local_1a8;
                  MVar13 = Sector::add((Sector *)&uTail,&data,SUB41(local_1a4,0),(byte)local_1a8);
                  if (MVar13 == Unchanged) {
                    args_1_01 = (DataRate *)
                                ((ulong)local_1e8.
                                        super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                                        super__Vector_impl_data._M_start & 0xffffffff);
                    eo.signature._0_8_ =
                         CHSR(local_29c,local_298,(int)uVar26,
                              local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
                    Message<char_const*>(msgInfo,"ignored identical data copy of %s",(char **)&eo);
                  }
                }
                std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                          ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
              }
              Track::add(&track,(Sector *)&uTail);
              std::vector<Data,_std::allocator<Data>_>::~vector(&local_1c8);
            }
            uVar22 = MemFile::tell(local_290);
            uVar20 = local_1b0;
            uVar26 = (ulong)uVar22;
            MemFile::seek(local_290,uTrackSize + iVar10);
            if (local_250 == 0x45) {
              uVar22 = uVar22 + 0xff & 0xffffff00;
              uVar26 = (ulong)uVar22;
              uVar25 = uVar22 - iVar10;
              if (uVar25 != uTrackSize) {
                if ((uVar25 & 0xffff) == uTrackSize) {
                  uTail = (size_t)CH(local_29c,local_298);
                  eo.signature._0_4_ = uVar25;
                  args_1_01 = (DataRate *)&eo;
                  Message<char_const*,int,int&>
                            (msgWarning,"%s size (%u) does not match index entry (%u)",
                             (char **)&uTail,(int *)args_1_01,&uTrackSize);
                  MemFile::seek(local_290,uVar22);
                }
                else {
                  uTail = (size_t)CH(local_29c,local_298);
                  eo.signature._0_4_ = uVar25;
                  args_1_01 = (DataRate *)&eo;
                  Message<char_const*,int,int&>
                            (msgWarning,"%s size (%u) does not match index entry (%u)",
                             (char **)&uTail,(int *)args_1_01,&uTrackSize);
                }
              }
            }
            uVar26 = CONCAT71((int7)(uVar26 >> 8),1);
            if ((local_1a0 & 1) == 0) {
              bVar27 = Track::is_8k_sector(&track);
              if (bVar27) {
                this = Track::operator[](&track,0);
                iVar10 = Sector::data_size(this);
                if (iVar10 == 0x1800) {
                  Message<>(msgWarning,"missing checksums needed to verify 8K sector integrity");
                  goto LAB_0018dc91;
                }
              }
              uVar26 = 0;
            }
LAB_0018dc91:
            Disk::write((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                        (int)&cylhead,&track,(size_t)args_1_01);
            std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
            local_1a0 = uVar26;
          }
          uVar22 = local_298 + 1;
        }
        uVar9 = local_29c + 1;
      }
      if ((local_250 == 0x45) &&
         (sVar14 = MemFile::read(local_290,(int)&eo,(void *)0xf,1), (int)sVar14 != 0)) {
        iVar10 = bcmp(&eo,"Offset-Info\r\n",0xb);
        if (iVar10 == 0) {
          Range::Range((Range *)&track,uVar20,num_heads);
          local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pMVar5;
          local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dsk.cpp:368:37)>
                        ::_M_invoke;
          local_1e8.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)std::
                        _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dsk.cpp:368:37)>
                        ::_M_manager;
          uTail = (size_t)disk;
          Range::each((Range *)&track,(function<void_(const_CylHead_&)> *)&uTail,false);
          std::_Function_base::~_Function_base((_Function_base *)&uTail);
        }
        else {
          iVar10 = MemFile::tell(pMVar5);
          MemFile::seek(pMVar5,iVar10 + -0xf);
        }
      }
      do {
        sVar14 = MemFile::read(local_290,(int)ab,(void *)0x100,1);
        if ((int)sVar14 == 0) {
LAB_0018de8e:
          pMVar5 = local_290;
          iVar10 = MemFile::size(local_290);
          iVar11 = MemFile::tell(pMVar5);
          sVar24 = (size_t)(iVar10 - iVar11);
          uTail = sVar24;
          if (iVar10 - iVar11 != 0) {
            pDVar18 = MemFile::data(pMVar5);
            puVar4 = (pDVar18->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar10 = MemFile::tell(pMVar5);
            args_1 = puVar4 + iVar10;
            iVar10 = bcmp(args_1,puVar4 + (long)iVar10 + 1,sVar24 - 1);
            if (iVar10 == 0) {
              Message<unsigned_long&,unsigned_char_const&>
                        (msgWarning,"file ends with %u bytes of %02X filler",&uTail,args_1);
            }
            else {
              Message<unsigned_long&>
                        (msgWarning,"%u bytes of unused data found at end of file:",&uTail);
              pDVar18 = MemFile::data(pMVar5);
              it._M_current =
                   (pDVar18->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              pDVar18 = MemFile::data(pMVar5);
              itEnd._M_current =
                   (pDVar18->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              iVar10 = MemFile::tell(pMVar5);
              util::
              hex_dump<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (it,itEnd,iVar10,(colour *)0x0,0x10);
            }
          }
          std::__cxx11::string::assign
                    ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                              ->strType);
          MEMORY::~MEMORY(&mem);
          return true;
        }
        iVar10 = bcmp(ab,"Track-Info\r\n",10);
        if ((iVar10 != 0) || (ab[0x15] != '\0')) {
          iVar10 = MemFile::tell(local_290);
          MemFile::seek(local_290,iVar10 + -0x100);
          goto LAB_0018de8e;
        }
        uTail = (size_t)CH((uint)ab[0x10],(uint)ab[0x11]);
        Message<char_const*>(msgWarning,"blank %s should not have EDSK track block",(char **)&uTail)
        ;
      } while( true );
    }
    peVar17 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[25],unsigned_char&,char_const(&)[2]>
              (peVar17,(char (*) [25])"invalid cylinder count (",&cyls,(char (*) [2])0x1a9e10);
  }
  else {
    peVar17 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[21],unsigned_char&,char_const(&)[2]>
              (peVar17,(char (*) [21])"invalid head count (",&heads,(char (*) [2])0x1a9e10);
  }
  __cxa_throw(peVar17,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadDSK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    uint8_t ab[256];
    if (!file.rewind() || !file.read(&ab, sizeof(ab)))
        return false;

    auto peh = reinterpret_cast<EDSK_HEADER*>(ab);
    if (memcmp(peh->szSignature, EDSK_SIGNATURE, 8) &&  // match: "EXTENDED" only
        memcmp(peh->szSignature, DSK_SIGNATURE, 8)) // match: "MV - CPC"
        return false;

    auto pbIndex = reinterpret_cast<const uint8_t*>(peh + 1);
    auto max_cyls = (sizeof(ab) - sizeof(EDSK_HEADER)) / MAX_SIDES;
    bool fEDSK = peh->szSignature[0] == EDSK_SIGNATURE[0];

    // Warn if the deprecated 'random data errors' flag is set
    if (peh->bSides & 0x80)
    {
        Message(msgWarning, "ignoring deprecated 'random data errors' flag");
        peh->bSides &= ~0x80;
    }

    uint8_t cyls = peh->bTracks;
    uint8_t heads = peh->bSides;

    if (heads > MAX_SIDES)
        throw util::exception("invalid head count (", heads, ")");
    else if (cyls > MAX_TRACKS || cyls > max_cyls)
        throw util::exception("invalid cylinder count (", cyls, ")");

    disk->metadata["creator"] = util::trim(std::string(peh->szCreator, sizeof(peh->szCreator)));

    MEMORY mem(ESDK_MAX_TRACK_SIZE);
    bool fWarned6K = false;

    for (uint8_t cyl = 0; cyl < cyls; ++cyl)
    {
        for (uint8_t head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            static const DataRate abEDSKRates[] = { DataRate::_250K, DataRate::_250K, DataRate::_500K, DataRate::_1M };

            // Remember the start position
            auto uTrackStart = file.tell();

            // EDSK supports variable track size, DSK has it fixed for the entire image
            auto uTrackSize = fEDSK ? (pbIndex[cyl * heads + head] << 8) : ((peh->abTrackSize[1] << 8) | peh->abTrackSize[0]);

            // EDSK doesn't store blank tracks, as indicated by zero size in the index
            if (fEDSK && !uTrackSize)
            {
                disk->write(cylhead, Track());
                continue;
            }

            // SugarBox (<= 0.22) doesn't write blank tracks at the end of the disk.
            if (cyl >= 40 && file.tell() == file.size())
            {
                Message(msgWarning, "%s track header is missing, assuming blank track", CH(cyl, head));
                disk->write(cylhead, Track());
                continue;
            }

            EDSK_TRACK th;
            if (!file.read(&th, sizeof(th)))
                throw util::exception("short file reading ", cylhead);

            // Check for "Track-Info", tolerating \r\n missing in bad images (Addams Family)
            if (memcmp(th.signature, EDSK_TRACK_SIG, 10))
                throw util::exception("track signature missing on ", cylhead);

            // Warn if the track sector size is invalid
            if (!fEDSK && th.size > SIZE_MASK_765)
                Message(msgWarning, "invalid sector size code (%s) on %s", SizeStr(th.size), CH(cyl, head));

            if (th.track != cyl || th.side != head)
            {
                if (th.track != cyl) Message(msgWarning, "header track %s != cyl %s", CylStr(th.track), CylStr(cyl));
                else Message(msgWarning, "header side %s != head %s", HeadStr(th.side), HeadStr(head));
            }

            // SAMdisk initially implemented John Elliot's rate+encoding extension in the wrong place.
            // If we find values in the wrong place, and none set in the right place, move them over!
            if (th.rate == 0 && th.unused[0]) { th.rate = th.unused[0]; th.unused[0] = 0; }
            if (th.encoding == 0 && th.unused[1]) { th.encoding = th.unused[1]; th.unused[1] = 0; }

            // Warn if the unused fields are used
            if (th.unused[0] || th.unused[1] || th.unused[2])
                Message(msgWarning, "unused fields are non-zero (%02X %02X %02X) on %s", th.unused[0], th.unused[1], th.unused[2], CH(cyl, head));

            DataRate datarate = (th.rate >= 1 && th.rate <= 3) ? abEDSKRates[th.rate] : DataRate::_250K;
            Encoding encoding = (th.encoding != 1) ? Encoding::MFM : Encoding::FM;
            Track track(th.sectors);

            // Determine the track header size, and the start of the data beyond it
            // Round the header size to the next 256-byte boundary
            int uSectorHeaders = (sizeof(EDSK_TRACK) + th.sectors * sizeof(EDSK_SECTOR) + 0xff) & ~0xff;
            uSectorHeaders -= sizeof(EDSK_TRACK);
            int uMinimum = th.sectors * sizeof(EDSK_SECTOR);

            // CPCDiskXP writes a truncated track header if the final track is blank.
            // Check if only the minimum header size has been supplied.
            if (uMinimum < uSectorHeaders && (file.size() - file.tell()) == uMinimum)
                Message(msgWarning, "%s track header is shorter than index size", CH(cyl, head));
            else if (!file.read(mem, uSectorHeaders))
                throw util::exception("short file reading ", cylhead, " sector headers");

            for (uint8_t sec = 0; sec < th.sectors; ++sec)
            {
                auto ps = &reinterpret_cast<EDSK_SECTOR*>(mem.pb)[sec];
                Sector sector(datarate, encoding, Header(ps->track, ps->side, ps->sector, ps->size));

                // Set gap3 on all but final setor
                if (sec < th.sectors - 1)
                {
                    sector.gap3 = th.gap3;

                    // If the sector uses a default gap3 size, clear it. This allows overrides by stored gap3
                    // in ALLGAPS images, and also prevents the default value showing up in track scans.
                    // If the same image is written back, any unset gap3 will be restored to the same value.
                    if (sector.gap3 == EDSK_DEFAULT_GAP3 || sector.gap3 == CPC_DEFAULT_GAP3)
                        sector.gap3 = 0;
                }

                uint8_t status1 = ps->status1, status2 = ps->status2;
                bool id_crc_error = (status1 & SR1_CRC_ERROR) != 0;
                bool data_not_found = (status2 & SR2_MISSING_ADDRESS_MARK) != 0;
                bool data_crc_error = (status2 & SR2_CRC_ERROR_IN_SECTOR_DATA) != 0;
                bool deleted_dam = (status2 & SR2_SECTOR_WITH_DELETED_DATA) != 0;

                // uPD765 sets both id and data flags for data CRC errors
                if (data_crc_error)
                    id_crc_error = false;
                else if (id_crc_error)
                    sector.set_badidcrc();

                // Check for an impossible flag combo, used for storing placeholder sectors (Logo Professor test)
                if (status1 & SR1_CRC_ERROR && status2 & SR2_MISSING_ADDRESS_MARK)
                {
                    Message(msgWarning, "unsupported placeholder sector on %s", CHSR(cyl, head, sec, sector.header.sector));
                    status2 &= ~SR2_MISSING_ADDRESS_MARK;
                }

                // Check for bits that shouldn't be set in the status bytes
                if ((status1 & (SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2)) ||
                    (status2 & (SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED)))
                {
                    Message(msgWarning, "invalid status (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));

                    // Clear the unexpected bits and continue
                    status1 &= ~(SR1_WRITE_PROTECT_DETECTED | SR1_RESERVED1 | SR1_RESERVED2);
                    status2 &= ~(SR2_SCAN_COMMAND_FAILED | SR2_SCAN_COMMAND_EQUAL | SR2_RESERVED);
                }

                // Match expected flag combinations, to identify unusual combinations that could indicate a bogus dump
                if (!(
                    (status1 == SR1_SUCCESS && status2 == SR2_SUCCESS) ||                   // normal data
                    (status1 == SR1_SUCCESS && status2 == SR2_SECTOR_WITH_DELETED_DATA) ||  // deleted data
                    (status1 == SR1_END_OF_CYLINDER && status2 == SR2_SUCCESS) ||                   // end of track?
                    (status1 == SR1_CRC_ERROR && status2 == SR2_SUCCESS) ||                 // id crc error
                    (status1 == SR1_CRC_ERROR && status2 == SR2_CRC_ERROR_IN_SECTOR_DATA) ||    // normal data CRC error
                    (status1 == SR1_CRC_ERROR && status2 == (SR2_CRC_ERROR_IN_SECTOR_DATA | SR2_SECTOR_WITH_DELETED_DATA)) ||   // deleted data CRC error
                    (status1 == SR1_CANNOT_FIND_ID_ADDRESS && status2 == SR2_MISSING_ADDRESS_MARK) ||       // data field missing (some FDCs set AM in ST1)
                    (status1 == SR1_SUCCESS && status2 == SR2_MISSING_ADDRESS_MARK) ||      // data field missing (some FDCs don't)
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_SUCCESS) ||                 // CHRN mismatch
                    (status1 == SR1_CANNOT_FIND_SECTOR_ID && status2 == SR2_WRONG_CYLINDER_DETECTED)        // CHRN mismatch, including wrong cylinder
                    ))
                {
                    Message(msgWarning, "unusual status flags (ST1=%02X ST2=%02X) for %s", status1, status2, CHSR(cyl, head, sec, sector.header.sector));
                }

                auto native_size = sector.size();
                auto data_size = fEDSK ? (ps->datahigh << 8) | ps->datalow : Sector::SizeCodeToLength(th.size);
                auto num_copies = data_not_found ? 0 : 1;

                // EDSK data field with gap data or multiple copies?
                if (fEDSK && data_size > native_size)
                {
                    // Multiple error copies extension?
                    // Also accept 48K as 3x16K copies, as found in early public test images.
                    if (data_crc_error && ((data_size % native_size) == 0 || data_size == 49152))
                    {
                        // Accept 48K as 3x16K, regardless of native size
                        if (data_size == 49152)
                            num_copies = 3;

                        // Otherwise it's a straight multiple
                        else
                            num_copies = data_size / native_size;

                        // Calculate the size stored for each copy
                        data_size /= num_copies;
                    }
                }

                // Process each copy
                for (auto u = 0; u < num_copies; ++u)
                {
                    // Allocate enough space for the data, with at least the native size
                    Data data(data_size);

                    // Read the data copy
                    if (!file.read(data))
                        throw util::exception("short file reading ", cylhead, " sector ", sector.header.sector);

                    // CPDRead sometimes stores too much data. If we find a data size that is an exact multiple on an
                    // error free sector, trim it down to the natural size.
                    if (opt.fix != 0 && disk->metadata["creator"].substr(0, 3) == "CPD" &&
                        data_size > native_size && !data_crc_error && !(data_size % native_size))
                    {
                        // Example: Discology +3.dsk (SDP)
                        Message(msgFix, "dropping suspicious excess data on %s", CHSR(cyl, head, sec, sector.header.sector));
                        data.resize(native_size);
                    }

                    // Data CRC, size 1 above multiple of native, and dummy marker byte at the end of the data?
                    // ToDo: document horrid hack
                    if (data_crc_error && (data_size % native_size) == 1 && data[data_size - 1] == 123)
                    {
                        // Remove the dummy byte
                        data.resize(--data_size);
                    }

                    // Old-style DSK images have some restrictions
                    if (!fEDSK)
                    {
                        // Sectors without a data field have no data
                        if (id_crc_error || data_not_found)
                            continue;

                        // Gap data is not supported
                        if (data_size > native_size)
                            data.resize(data_size);
                    }

                    if (id_crc_error || data_not_found)
                        Message(msgWarning, "ignoring stored data on %s, which has no data field", CHSR(cyl, head, sec, sector.header.sector));
                    else
                    {
                        auto res = sector.add(std::move(data), data_crc_error, deleted_dam ? 0xf8 : 0xfb);
                        if (res == Sector::Merge::Unchanged)
                            Message(msgInfo, "ignored identical data copy of %s", CHSR(cyl, head, sec, sector.header.sector));
                    }
                }

                track.add(std::move(sector));
            }

            // Calculate the used track size, rounded up to the next 256 bytes
            auto uTrackEnd = (file.tell() + 0xff) & ~0xff;

            // Seek past the size indicated by the index
            file.seek(uTrackStart + uTrackSize);

            // With EDSK images the used size should match what the index says
            if (fEDSK && (uTrackEnd - uTrackStart) != uTrackSize)
            {
                // If the low 16-bits are different, we'll stick with trusting the index size
                if (((uTrackEnd - uTrackStart) & 0xffff) != uTrackSize)
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                else
                {
                    // The track size probably overflowed (some WinAPE images), so trust the used size
                    Message(msgWarning, "%s size (%u) does not match index entry (%u)", CH(cyl, head), uTrackEnd - uTrackStart, uTrackSize);
                    file.seek(uTrackEnd);
                }
            }

            // Legacy EDSK images only store 6K data for 8K sectors, so any
            // checksum bytes the disk may have had are lost.
            if (!fWarned6K && track.is_8k_sector() && track[0].data_size() == 6144)
            {
                Message(msgWarning, "missing checksums needed to verify 8K sector integrity");
                fWarned6K = true;
            }

            disk->write(cylhead, std::move(track));
        }
    }

    // Check for Offset-Info header at normal file end
    EDSK_OFFSETS eo;
    if (fEDSK && file.read(&eo, sizeof(eo), 1))
    {
        if (!memcmp(eo.signature, EDSK_OFFSETS_SIG, 11))
        {
            Range(cyls, heads).each([&](const CylHead& cylhead) {
                auto track = disk->read_track(cylhead);

                uint16_t val;
                if (file.read(&val, sizeof(val), 1))
                    track.tracklen = util::letoh(val) * 16; // convert to bitstream bits

                for (auto& sector : track.sectors())
                {
                    if (file.read(&val, sizeof(val), 1))
                        sector.offset = util::letoh(val) * 16;  // convert to bitstream bits
                }

                disk->write(cylhead, std::move(track));
                });
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(eo));
        }
    }

    // Check for blank track headers that RealSpectrum adds to files, despite the spec saying it shouldn't:
    // "A size of "0" indicates an unformatted track. In this case there is no data, and no track
    //  information block for this track in the image file!"
    EDSK_TRACK* pth = reinterpret_cast<EDSK_TRACK*>(ab);
    while (file.read(ab, sizeof(ab), 1))
    {
        if (!memcmp(pth->signature, EDSK_TRACK_SIG, 10) && !pth->sectors)
        {
            // Example: Fun School 2 For The Over-8s.dsk (SDP +3)
            Message(msgWarning, "blank %s should not have EDSK track block", CH(pth->track, pth->side));
        }
        else
        {
            // Undo non-matching read
            file.seek(file.tell() - sizeof(ab));
            break;
        }
    }

    size_t uTail = file.size() - file.tell();
    if (uTail)
    {
        auto pbTail = file.data().data() + file.tell();

        if (!memcmp(pbTail, pbTail + 1, uTail - 1))
        {
            // Example: Compilation Disk 048 (19xx)(-).zip  (TOSEC CPC Compilations)
            Message(msgWarning, "file ends with %u bytes of %02X filler", uTail, *pbTail);
        }
        else
        {
            // Example: Silva (1985)(Lankhor)(fr)[cr Genesis][t Genesis].zip (TOSEC CPC Games)
            Message(msgWarning, "%u bytes of unused data found at end of file:", uTail);
            util::hex_dump(file.data().begin(), file.data().end(), file.tell());
        }
    }

    disk->strType = "EDSK";
    return true;
}